

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O2

void puppup::movegen::print(Move *mov,State *state,Gaddag *gaddag)

{
  ostream *poVar1;
  long lVar2;
  idx *piVar3;
  byte bVar4;
  idx aiStack_1048 [514];
  string local_38 [32];
  
  bVar4 = 0;
  if (mov->word == -1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"CHANGE 7");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  piVar3 = aiStack_1048;
  for (lVar2 = 0x201; lVar2 != 0; lVar2 = lVar2 + -1) {
    *piVar3 = state->score;
    state = (State *)((long)state + (ulong)bVar4 * -0x10 + 8);
    piVar3 = piVar3 + (ulong)bVar4 * -2 + 1;
  }
  toString_abi_cxx11_(local_38,(movegen *)mov,gaddag);
  poVar1 = std::operator<<((ostream *)&std::cout,local_38);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

inline void print(const Move& mov, const board::State& state,
                  const trie::Gaddag& gaddag) {
    if (mov.word == -1) {
        std::cout << "CHANGE 7" << std::endl;
    }
    std::cout << toString(mov, state, gaddag) << " " << mov.score << std::endl;
}